

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::writeHSharedObject(QPDF *this,BitWriter *w)

{
  int nitems_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec;
  unsigned_long_long val;
  unsigned_long uVar2;
  reference pvVar3;
  ulong __n;
  allocator<char> local_6d;
  int nitems;
  Members *local_68;
  BitWriter *local_60;
  QPDF *local_58;
  string local_50;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_58 = this;
  BitWriter::writeBitsInt(w,((_Var1._M_head_impl)->shared_object_hints).first_shared_obj,0x20);
  val = QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::convert
                  ((qpdf_offset_t *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8));
  BitWriter::writeBits(w,val,0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20),0x10);
  nitems_00 = *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14);
  vec = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
        ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28);
  __n = 0;
  nitems = nitems_00;
  local_68 = _Var1._M_head_impl;
  write_vector_int<QPDF::HSharedObjectEntry,int>
            (w,nitems_00,vec,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20),0);
  local_60 = w;
  write_vector_int<QPDF::HSharedObjectEntry,int>(w,nitems_00,vec,1,4);
  while( true ) {
    uVar2 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&nitems);
    if (uVar2 <= __n) break;
    pvVar3 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (vec,__n);
    if (pvVar3->signature_present != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "found unexpected signature present while writing linearization data",&local_6d);
      stopOnError(local_58,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    __n = __n + 1;
  }
  write_vector_int<QPDF::HSharedObjectEntry,int>
            (local_60,nitems,vec,(local_68->shared_object_hints).nbits_nobjects,8);
  return;
}

Assistant:

void
QPDF::writeHSharedObject(BitWriter& w)
{
    HSharedObject& t = m->shared_object_hints;

    w.writeBitsInt(t.first_shared_obj, 32);         // 1
    w.writeBits(toULL(t.first_shared_offset), 32);  // 2
    w.writeBitsInt(t.nshared_first_page, 32);       // 3
    w.writeBitsInt(t.nshared_total, 32);            // 4
    w.writeBitsInt(t.nbits_nobjects, 16);           // 5
    w.writeBitsInt(t.min_group_length, 32);         // 6
    w.writeBitsInt(t.nbits_delta_group_length, 16); // 7

    QTC::TC(
        "qpdf",
        "QPDF lin write nshared_total > nshared_first_page",
        (t.nshared_total > t.nshared_first_page) ? 1 : 0);

    int nitems = t.nshared_total;
    std::vector<HSharedObjectEntry>& entries = t.entries;

    write_vector_int(
        w, nitems, entries, t.nbits_delta_group_length, &HSharedObjectEntry::delta_group_length);
    write_vector_int(w, nitems, entries, 1, &HSharedObjectEntry::signature_present);
    for (size_t i = 0; i < toS(nitems); ++i) {
        // If signature were present, we'd have to write a 128-bit hash.
        if (entries.at(i).signature_present != 0) {
            stopOnError("found unexpected signature present while writing linearization data");
        }
    }
    write_vector_int(w, nitems, entries, t.nbits_nobjects, &HSharedObjectEntry::nobjects_minus_one);
}